

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O0

void __thiscall
embree::XMLWriter::store
          (XMLWriter *this,Ref<embree::SceneGraph::AnimatedLightNode> *node,ssize_t id)

{
  ulong uVar1;
  size_type sVar2;
  int __oflag;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  XMLWriter *in_RDI;
  size_t i;
  Ref<embree::SceneGraph::Node> *in_stack_000001b8;
  XMLWriter *in_stack_000001c0;
  undefined8 in_stack_fffffffffffffdf8;
  float __val;
  allocator *paVar3;
  char *in_stack_fffffffffffffe00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe08;
  allocator local_1b1;
  string local_1b0 [32];
  LightNode *local_190;
  ulong local_188;
  string local_180 [32];
  string local_160 [55];
  allocator local_129;
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [88];
  reference local_30;
  LightNode **local_28;
  LightNode **local_20;
  LightNode *local_10;
  LightNode **local_8;
  
  __val = (float)((ulong)in_stack_fffffffffffffdf8 >> 0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_128,"AnimatedLight ",&local_129);
  std::operator+(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
  std::__cxx11::to_string(__val);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,in_RSI)
  ;
  std::operator+(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
  std::__cxx11::to_string(__val);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,in_RSI)
  ;
  std::operator+(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
  open(in_RDI,(char *)local_88,__oflag);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string(local_180);
  std::__cxx11::string::~string(local_c8);
  std::__cxx11::string::~string(local_e8);
  std::__cxx11::string::~string(local_160);
  std::__cxx11::string::~string(local_108);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  local_188 = 0;
  while( true ) {
    uVar1 = local_188;
    sVar2 = std::
            vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
            ::size((vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
                    *)(*(long *)in_RSI + 0x68));
    if (sVar2 <= uVar1) break;
    local_30 = std::
               vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
               ::operator[]((vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
                             *)(*(long *)in_RSI + 0x68),local_188);
    local_28 = &local_190;
    local_10 = local_30->ptr;
    local_8 = &local_190;
    local_190 = local_10;
    if (local_10 != (LightNode *)0x0) {
      (*(local_10->super_Node).super_RefCount._vptr_RefCount[2])();
    }
    store(in_stack_000001c0,in_stack_000001b8);
    local_20 = &local_190;
    if (local_190 != (LightNode *)0x0) {
      (*(local_190->super_Node).super_RefCount._vptr_RefCount[3])();
    }
    local_188 = local_188 + 1;
  }
  paVar3 = &local_1b1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b0,"AnimatedLight",paVar3);
  close(in_RDI,(int)local_1b0);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  return;
}

Assistant:

void XMLWriter::store(Ref<SceneGraph::AnimatedLightNode> node, ssize_t id)
  {
    open(std::string("AnimatedLight ")+
         "time_range=\""+std::to_string(node->time_range.lower)+" "+std::to_string(node->time_range.upper)+"\"");
    
    for (size_t i=0; i<node->lights.size(); i++)
      store(node->lights[i].dynamicCast<SceneGraph::Node>());
    
    close("AnimatedLight");
  }